

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O1

void __thiscall ByteData_Push_Test::~ByteData_Push_Test(ByteData_Push_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ByteData, Push) {
  ByteData base("0011");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData data = base;

  EXPECT_NO_THROW(data.Push(data1));
  EXPECT_STREQ(data.GetHex().c_str(), "00112233");

  EXPECT_NO_THROW(data.Push(data2));
  EXPECT_STREQ(data.GetHex().c_str(), "001122334444444444444444444444444444444444444444");

  EXPECT_NO_THROW(data.Push(data3));
  EXPECT_STREQ(data.GetHex().c_str(), "0011223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555");
}